

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempArenaAllocatorObject.cpp
# Opt level: O0

void __thiscall
Js::TempArenaAllocatorWrapper<true>::Dispose(TempArenaAllocatorWrapper<true> *this,bool isShutdown)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  undefined4 *puVar4;
  bool isShutdown_local;
  TempArenaAllocatorWrapper<true> *this_local;
  
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Clear
            (&(this->allocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  if (this->externalGuestArenaRef != (Type)0x0) {
    Memory::Recycler::UnregisterExternalGuestArena(this->recycler,this->externalGuestArenaRef);
    this->externalGuestArenaRef = (Type)0x0;
  }
  sVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocatedSize
                    (&(this->allocator).
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  if (sVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/TempArenaAllocatorObject.cpp"
                                ,0x27,"(allocator.AllocatedSize() == 0)",
                                "allocator.AllocatedSize() == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void TempArenaAllocatorWrapper<isGuestArena>::Dispose(bool isShutdown)
    {
        allocator.Clear();
        if (isGuestArena && externalGuestArenaRef != nullptr)
        {
            this->recycler->UnregisterExternalGuestArena(externalGuestArenaRef);
            externalGuestArenaRef = nullptr;
        }

        Assert(allocator.AllocatedSize() == 0);
    }